

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_6::TwoLevelIterator::SetDataIterator
          (TwoLevelIterator *this,Iterator *data_iter)

{
  Iterator *in_RAX;
  char *pcVar1;
  Iterator *local_28;
  
  if ((this->data_iter_).iter_ != (Iterator *)0x0) {
    local_28 = in_RAX;
    IteratorWrapper::status((IteratorWrapper *)&local_28);
    if (local_28 != (Iterator *)0x0 && (this->status_).state_ == (char *)0x0) {
      pcVar1 = Status::CopyState((char *)local_28);
      (this->status_).state_ = pcVar1;
    }
    if (local_28 != (Iterator *)0x0) {
      operator_delete__(local_28);
    }
  }
  IteratorWrapper::Set(&this->data_iter_,data_iter);
  return;
}

Assistant:

void TwoLevelIterator::SetDataIterator(Iterator* data_iter) {
  if (data_iter_.iter() != nullptr) SaveError(data_iter_.status());
  data_iter_.Set(data_iter);
}